

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testValidModelValidMultipleSoftmax_2(void)

{
  bool bVar1;
  NeuralNetwork *pNVar2;
  ostream *poVar3;
  Model m;
  Result res;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_68;
  TensorAttributes outTensorAttr;
  TensorAttributes inTensorAttr;
  
  CoreML::Specification::Model::Model(&m);
  buildBasicUpdatableNeuralNetworkModel(&m);
  pNVar2 = addSoftmaxLayer(&m,"softmax","B","softmax_out");
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            (&m,pNVar2,"cross_entropy_loss_layer","softmax_out","label_target");
  inTensorAttr.name = "softmax_out";
  inTensorAttr.dimension = 1;
  inTensorAttr._12_4_ = 0;
  outTensorAttr.name = "inner_layer_after_softmax_out";
  outTensorAttr.dimension = 1;
  outTensorAttr._12_4_ = 0;
  addInnerProductLayer(&m,true,"inner_layer_after_softmax",&inTensorAttr,&outTensorAttr,false,false)
  ;
  pNVar2 = addSoftmaxLayer(&m,"softmax_2","inner_layer_after_softmax_out","softmax_2_out");
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (pNVar2,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (pNVar2,kSgdOptimizer,10,5,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_68);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_68);
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl._0_8_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  addEpochs<CoreML::Specification::NeuralNetwork>
            (pNVar2,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_98);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_98);
  CoreML::Model::validate(&res,&m);
  bVar1 = CoreML::Result::good(&res);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x278);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"(res).good()");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m);
  return (uint)!bVar1;
}

Assistant:

int testValidModelValidMultipleSoftmax_2() {

    // This test creates the following model. This is a valid model. The first softmax is attached to CCE.
    // Second softmax is also valid. Although it is not attached to CCE, it is out of backpropagation scope.
    //     -----        --       -----       --
    //    |Dense| -- > |SM| --> |Dense| --> |SM|
    //     -----        --       -----       --
    //     updatable    |        updatable
    //                  |     ---
    //                   --> |CCE|
    //                        ---

    Specification::Model m;
    auto *nn = buildBasicUpdatableNeuralNetworkModel(m);

    // add a softmax layer
    nn = addSoftmaxLayer(m, "softmax", "B", "softmax_out");

    // attach a CCE loss layer to softmax
    addCategoricalCrossEntropyLoss(m, nn, "cross_entropy_loss_layer", "softmax_out", "label_target");

    // attch an updatable inner product layer to the softmax
    TensorAttributes inTensorAttr = { "softmax_out", 1 };
    TensorAttributes outTensorAttr = { "inner_layer_after_softmax_out", 1 };
    nn = addInnerProductLayer(m, true, "inner_layer_after_softmax", &inTensorAttr, &outTensorAttr);

    // add a second softmax layer
    nn = addSoftmaxLayer(m, "softmax_2", "inner_layer_after_softmax_out", "softmax_2_out");

    // now add an updatable model parameter.
    addLearningRate(nn, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(nn, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(nn, 100, 1, 100, std::set<int64_t>());

    Result res = Model::validate(m);
    ML_ASSERT_GOOD(res);
    return 0;
}